

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint uVar18;
  Intersectors *pIVar19;
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 (*pauVar29) [16];
  int iVar30;
  long lVar31;
  long lVar32;
  byte bVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  Scene *scene;
  ulong uVar40;
  size_t sVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar97;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar98 [32];
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [32];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_13b8) [16];
  undefined8 local_1380;
  undefined8 uStack_1378;
  long local_1370;
  ulong local_1368;
  ulong local_1360;
  ulong local_1358;
  ulong local_1350;
  ulong local_1348;
  RTCFilterFunctionNArguments local_1340;
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined1 local_12a0 [16];
  float local_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float local_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined1 local_1260 [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  RTCHitN local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined4 local_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  uint local_11a0;
  uint uStack_119c;
  uint uStack_1198;
  uint uStack_1194;
  uint uStack_1190;
  uint uStack_118c;
  uint uStack_1188;
  uint uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  uint uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  undefined1 local_1000 [32];
  undefined1 local_fe0;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar48 [16];
  
  local_13b8 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  local_12c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar112 = ZEXT1664(local_12c0);
  local_12d0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar113 = ZEXT1664(local_12d0);
  local_12e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar114 = ZEXT1664(local_12e0);
  fStack_1264 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_1274 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fStack_1284 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_12f0 = vbroadcastss_avx512vl(ZEXT416((uint)(fStack_1264 * 0.99999964)));
  auVar115 = ZEXT1664(local_12f0);
  local_1300 = vbroadcastss_avx512vl(ZEXT416((uint)(fStack_1274 * 0.99999964)));
  auVar116 = ZEXT1664(local_1300);
  local_1310 = vbroadcastss_avx512vl(ZEXT416((uint)(fStack_1284 * 0.99999964)));
  auVar117 = ZEXT1664(local_1310);
  fStack_1264 = fStack_1264 * 1.0000004;
  fStack_1274 = fStack_1274 * 1.0000004;
  fStack_1284 = fStack_1284 * 1.0000004;
  local_1350 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1358 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1360 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1368 = local_1350 ^ 0x10;
  uVar37 = local_1358 ^ 0x10;
  local_1348 = local_1360 ^ 0x10;
  iVar30 = (tray->tnear).field_0.i[k];
  local_12a0._4_4_ = iVar30;
  local_12a0._0_4_ = iVar30;
  local_12a0._8_4_ = iVar30;
  local_12a0._12_4_ = iVar30;
  auVar111 = ZEXT1664(local_12a0);
  iVar30 = (tray->tfar).field_0.i[k];
  auVar88 = ZEXT1664(CONCAT412(iVar30,CONCAT48(iVar30,CONCAT44(iVar30,iVar30))));
  local_12b0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fStack_1268 = fStack_1264;
  fStack_126c = fStack_1264;
  local_1270 = fStack_1264;
  fStack_1278 = fStack_1274;
  fStack_127c = fStack_1274;
  local_1280 = fStack_1274;
  fStack_1288 = fStack_1284;
  fStack_128c = fStack_1284;
  local_1290 = fStack_1284;
  fVar110 = fStack_1284;
  fVar109 = fStack_1284;
  fVar108 = fStack_1284;
  fVar107 = fStack_1284;
  fVar106 = fStack_1274;
  fVar105 = fStack_1274;
  fVar104 = fStack_1274;
  fVar102 = fStack_1274;
  fVar101 = fStack_1264;
  fVar100 = fStack_1264;
  fVar99 = fStack_1264;
  fVar97 = fStack_1264;
  uVar42 = local_1358;
  uVar43 = local_1368;
  uVar44 = local_1360;
  uVar36 = local_1350;
  do {
    do {
      do {
        if (local_13b8 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar29 = local_13b8 + -1;
        local_13b8 = local_13b8 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar29 + 8));
      sVar41 = *(size_t *)*local_13b8;
      do {
        if ((sVar41 & 8) == 0) {
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar41 + 0x20 + uVar36),auVar112._0_16_);
          auVar45 = vmulps_avx512vl(auVar115._0_16_,auVar45);
          auVar46 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar41 + 0x20 + uVar42),auVar113._0_16_);
          auVar46 = vmulps_avx512vl(auVar116._0_16_,auVar46);
          auVar45 = vmaxps_avx(auVar45,auVar46);
          auVar46 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar41 + 0x20 + uVar44),auVar114._0_16_);
          auVar46 = vmulps_avx512vl(auVar117._0_16_,auVar46);
          auVar46 = vmaxps_avx(auVar46,auVar111._0_16_);
          auVar45 = vmaxps_avx(auVar45,auVar46);
          auVar46 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar41 + 0x20 + uVar43),auVar112._0_16_);
          auVar47._0_4_ = fVar97 * auVar46._0_4_;
          auVar47._4_4_ = fVar99 * auVar46._4_4_;
          auVar47._8_4_ = fVar100 * auVar46._8_4_;
          auVar47._12_4_ = fVar101 * auVar46._12_4_;
          auVar46 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar41 + 0x20 + uVar37),auVar113._0_16_);
          auVar48._0_4_ = fVar102 * auVar46._0_4_;
          auVar48._4_4_ = fVar104 * auVar46._4_4_;
          auVar48._8_4_ = fVar105 * auVar46._8_4_;
          auVar48._12_4_ = fVar106 * auVar46._12_4_;
          auVar46 = vminps_avx(auVar47,auVar48);
          auVar47 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar41 + 0x20 + local_1348),
                                    auVar114._0_16_);
          auVar90._0_4_ = fVar107 * auVar47._0_4_;
          auVar90._4_4_ = fVar108 * auVar47._4_4_;
          auVar90._8_4_ = fVar109 * auVar47._8_4_;
          auVar90._12_4_ = fVar110 * auVar47._12_4_;
          auVar47 = vminps_avx(auVar90,auVar88._0_16_);
          auVar46 = vminps_avx(auVar46,auVar47);
          uVar16 = vcmpps_avx512vl(auVar45,auVar46,2);
          This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),(uint)(byte)uVar16);
          local_1180._0_16_ = auVar45;
        }
        if ((sVar41 & 8) == 0) {
          if (This == (Intersectors *)0x0) {
            iVar30 = 4;
          }
          else {
            uVar40 = sVar41 & 0xfffffffffffffff0;
            lVar39 = 0;
            for (pIVar19 = This; ((ulong)pIVar19 & 1) == 0;
                pIVar19 = (Intersectors *)((ulong)pIVar19 >> 1 | 0x8000000000000000)) {
              lVar39 = lVar39 + 1;
            }
            iVar30 = 0;
            uVar38 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
            sVar41 = *(ulong *)(uVar40 + lVar39 * 8);
            if (uVar38 != 0) {
              uVar34 = *(uint *)(local_1180 + lVar39 * 4);
              lVar39 = 0;
              for (uVar20 = uVar38; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                lVar39 = lVar39 + 1;
              }
              uVar38 = uVar38 - 1 & uVar38;
              uVar20 = *(ulong *)(uVar40 + lVar39 * 8);
              uVar18 = *(uint *)(local_1180 + lVar39 * 4);
              if (uVar38 == 0) {
                if (uVar34 < uVar18) {
                  *(ulong *)*local_13b8 = uVar20;
                  *(uint *)((long)*local_13b8 + 8) = uVar18;
                  local_13b8 = local_13b8 + 1;
                }
                else {
                  *(size_t *)*local_13b8 = sVar41;
                  *(uint *)((long)*local_13b8 + 8) = uVar34;
                  sVar41 = uVar20;
                  local_13b8 = local_13b8 + 1;
                }
              }
              else {
                auVar45._8_8_ = 0;
                auVar45._0_8_ = sVar41;
                auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar34));
                auVar46._8_8_ = 0;
                auVar46._0_8_ = uVar20;
                auVar46 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar18));
                lVar39 = 0;
                for (uVar20 = uVar38; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000)
                {
                  lVar39 = lVar39 + 1;
                }
                uVar38 = uVar38 - 1 & uVar38;
                auVar89._8_8_ = 0;
                auVar89._0_8_ = *(ulong *)(uVar40 + lVar39 * 8);
                auVar89 = vpunpcklqdq_avx(auVar89,ZEXT416(*(uint *)(local_1180 + lVar39 * 4)));
                auVar47 = vpshufd_avx(auVar45,0xaa);
                auVar48 = vpshufd_avx(auVar46,0xaa);
                auVar90 = vpshufd_avx(auVar89,0xaa);
                if (uVar38 == 0) {
                  uVar40 = vpcmpgtd_avx512vl(auVar48,auVar47);
                  uVar40 = uVar40 & 0xf;
                  auVar48 = vpblendmd_avx512vl(auVar46,auVar45);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar49._0_4_ = (uint)bVar15 * auVar48._0_4_ | (uint)!bVar15 * auVar47._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar49._4_4_ = (uint)bVar15 * auVar48._4_4_ | (uint)!bVar15 * auVar47._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar49._8_4_ = (uint)bVar15 * auVar48._8_4_ | (uint)!bVar15 * auVar47._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar49._12_4_ = (uint)bVar15 * auVar48._12_4_ | (uint)!bVar15 * auVar47._12_4_;
                  auVar46 = vmovdqa32_avx512vl(auVar46);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar50._0_4_ = (uint)bVar15 * auVar46._0_4_ | (uint)!bVar15 * auVar45._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar50._4_4_ = (uint)bVar15 * auVar46._4_4_ | (uint)!bVar15 * auVar45._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar50._8_4_ = (uint)bVar15 * auVar46._8_4_ | (uint)!bVar15 * auVar45._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar50._12_4_ = (uint)bVar15 * auVar46._12_4_ | (uint)!bVar15 * auVar45._12_4_;
                  auVar45 = vpshufd_avx(auVar49,0xaa);
                  uVar40 = vpcmpgtd_avx512vl(auVar90,auVar45);
                  uVar40 = uVar40 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar89,auVar49);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  bVar13 = (bool)((byte)(uVar40 >> 1) & 1);
                  sVar41 = CONCAT44((uint)bVar13 * auVar46._4_4_ | (uint)!bVar13 * auVar45._4_4_,
                                    (uint)bVar15 * auVar46._0_4_ | (uint)!bVar15 * auVar45._0_4_);
                  auVar45 = vmovdqa32_avx512vl(auVar89);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar51._0_4_ = (uint)bVar15 * auVar45._0_4_ | !bVar15 * auVar49._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar51._4_4_ = (uint)bVar15 * auVar45._4_4_ | !bVar15 * auVar49._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar51._8_4_ = (uint)bVar15 * auVar45._8_4_ | !bVar15 * auVar49._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar51._12_4_ = (uint)bVar15 * auVar45._12_4_ | !bVar15 * auVar49._12_4_;
                  auVar45 = vpshufd_avx(auVar51,0xaa);
                  auVar46 = vpshufd_avx(auVar50,0xaa);
                  uVar40 = vpcmpgtd_avx512vl(auVar45,auVar46);
                  uVar40 = uVar40 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar51,auVar50);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar52._0_4_ = (uint)bVar15 * auVar46._0_4_ | (uint)!bVar15 * auVar45._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar15 * auVar46._4_4_ | (uint)!bVar15 * auVar45._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar15 * auVar46._8_4_ | (uint)!bVar15 * auVar45._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar52._12_4_ = (uint)bVar15 * auVar46._12_4_ | (uint)!bVar15 * auVar45._12_4_;
                  auVar45 = vmovdqa32_avx512vl(auVar51);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar53._0_4_ = (uint)bVar15 * auVar45._0_4_ | !bVar15 * auVar50._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar15 * auVar45._4_4_ | !bVar15 * auVar50._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar15 * auVar45._8_4_ | !bVar15 * auVar50._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar53._12_4_ = (uint)bVar15 * auVar45._12_4_ | !bVar15 * auVar50._12_4_;
                  *local_13b8 = auVar53;
                  local_13b8[1] = auVar52;
                  local_13b8 = local_13b8 + 2;
                }
                else {
                  lVar39 = 0;
                  for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                    lVar39 = lVar39 + 1;
                  }
                  uVar34 = *(uint *)(local_1180 + lVar39 * 4);
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = *(ulong *)(uVar40 + lVar39 * 8);
                  auVar57 = vpunpcklqdq_avx(auVar94,ZEXT416(uVar34));
                  uVar40 = vpcmpgtd_avx512vl(auVar48,auVar47);
                  uVar40 = uVar40 & 0xf;
                  auVar48 = vpblendmd_avx512vl(auVar46,auVar45);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar54._0_4_ = (uint)bVar15 * auVar48._0_4_ | (uint)!bVar15 * auVar47._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar54._4_4_ = (uint)bVar15 * auVar48._4_4_ | (uint)!bVar15 * auVar47._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar54._8_4_ = (uint)bVar15 * auVar48._8_4_ | (uint)!bVar15 * auVar47._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar54._12_4_ = (uint)bVar15 * auVar48._12_4_ | (uint)!bVar15 * auVar47._12_4_;
                  auVar46 = vmovdqa32_avx512vl(auVar46);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar55._0_4_ = (uint)bVar15 * auVar46._0_4_ | (uint)!bVar15 * auVar45._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar55._4_4_ = (uint)bVar15 * auVar46._4_4_ | (uint)!bVar15 * auVar45._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar55._8_4_ = (uint)bVar15 * auVar46._8_4_ | (uint)!bVar15 * auVar45._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar55._12_4_ = (uint)bVar15 * auVar46._12_4_ | (uint)!bVar15 * auVar45._12_4_;
                  auVar91._4_4_ = uVar34;
                  auVar91._0_4_ = uVar34;
                  auVar91._8_4_ = uVar34;
                  auVar91._12_4_ = uVar34;
                  uVar40 = vpcmpgtd_avx512vl(auVar91,auVar90);
                  uVar40 = uVar40 & 0xf;
                  auVar45 = vpblendmd_avx512vl(auVar57,auVar89);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar56._0_4_ = (uint)bVar15 * auVar45._0_4_ | !bVar15 * uVar34;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar15 * auVar45._4_4_ | !bVar15 * uVar34;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar15 * auVar45._8_4_ | !bVar15 * uVar34;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar56._12_4_ = (uint)bVar15 * auVar45._12_4_ | !bVar15 * uVar34;
                  auVar45 = vmovdqa32_avx512vl(auVar57);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar57._0_4_ = (uint)bVar15 * auVar45._0_4_ | (uint)!bVar15 * auVar89._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar57._4_4_ = (uint)bVar15 * auVar45._4_4_ | (uint)!bVar15 * auVar89._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar57._8_4_ = (uint)bVar15 * auVar45._8_4_ | (uint)!bVar15 * auVar89._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar57._12_4_ = (uint)bVar15 * auVar45._12_4_ | (uint)!bVar15 * auVar89._12_4_;
                  auVar45 = vpshufd_avx(auVar57,0xaa);
                  auVar46 = vpshufd_avx(auVar55,0xaa);
                  uVar40 = vpcmpgtd_avx512vl(auVar45,auVar46);
                  uVar40 = uVar40 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar57,auVar55);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar58._0_4_ = (uint)bVar15 * auVar46._0_4_ | (uint)!bVar15 * auVar45._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar58._4_4_ = (uint)bVar15 * auVar46._4_4_ | (uint)!bVar15 * auVar45._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar58._8_4_ = (uint)bVar15 * auVar46._8_4_ | (uint)!bVar15 * auVar45._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar58._12_4_ = (uint)bVar15 * auVar46._12_4_ | (uint)!bVar15 * auVar45._12_4_;
                  auVar45 = vmovdqa32_avx512vl(auVar57);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar59._0_4_ = (uint)bVar15 * auVar45._0_4_ | !bVar15 * auVar55._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar59._4_4_ = (uint)bVar15 * auVar45._4_4_ | !bVar15 * auVar55._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar59._8_4_ = (uint)bVar15 * auVar45._8_4_ | !bVar15 * auVar55._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar59._12_4_ = (uint)bVar15 * auVar45._12_4_ | !bVar15 * auVar55._12_4_;
                  auVar45 = vpshufd_avx(auVar56,0xaa);
                  auVar46 = vpshufd_avx(auVar54,0xaa);
                  uVar40 = vpcmpgtd_avx512vl(auVar45,auVar46);
                  uVar40 = uVar40 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar56,auVar54);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  bVar13 = (bool)((byte)(uVar40 >> 1) & 1);
                  sVar41 = CONCAT44((uint)bVar13 * auVar46._4_4_ | (uint)!bVar13 * auVar45._4_4_,
                                    (uint)bVar15 * auVar46._0_4_ | (uint)!bVar15 * auVar45._0_4_);
                  auVar45 = vmovdqa32_avx512vl(auVar56);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar60._0_4_ = (uint)bVar15 * auVar45._0_4_ | !bVar15 * auVar54._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar60._4_4_ = (uint)bVar15 * auVar45._4_4_ | !bVar15 * auVar54._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar60._8_4_ = (uint)bVar15 * auVar45._8_4_ | !bVar15 * auVar54._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar60._12_4_ = (uint)bVar15 * auVar45._12_4_ | !bVar15 * auVar54._12_4_;
                  auVar45 = vpshufd_avx(auVar60,0xaa);
                  auVar46 = vpshufd_avx(auVar58,0xaa);
                  uVar40 = vpcmpgtd_avx512vl(auVar46,auVar45);
                  uVar40 = uVar40 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar58,auVar60);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar61._0_4_ = (uint)bVar15 * auVar46._0_4_ | (uint)!bVar15 * auVar45._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar61._4_4_ = (uint)bVar15 * auVar46._4_4_ | (uint)!bVar15 * auVar45._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar61._8_4_ = (uint)bVar15 * auVar46._8_4_ | (uint)!bVar15 * auVar45._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar61._12_4_ = (uint)bVar15 * auVar46._12_4_ | (uint)!bVar15 * auVar45._12_4_;
                  auVar45 = vmovdqa32_avx512vl(auVar58);
                  bVar15 = (bool)((byte)uVar40 & 1);
                  auVar62._0_4_ = (uint)bVar15 * auVar45._0_4_ | !bVar15 * auVar60._0_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  auVar62._4_4_ = (uint)bVar15 * auVar45._4_4_ | !bVar15 * auVar60._4_4_;
                  bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                  auVar62._8_4_ = (uint)bVar15 * auVar45._8_4_ | !bVar15 * auVar60._8_4_;
                  bVar15 = SUB81(uVar40 >> 3,0);
                  auVar62._12_4_ = (uint)bVar15 * auVar45._12_4_ | !bVar15 * auVar60._12_4_;
                  *local_13b8 = auVar59;
                  local_13b8[1] = auVar62;
                  local_13b8[2] = auVar61;
                  local_13b8 = local_13b8 + 3;
                }
              }
            }
          }
        }
        else {
          iVar30 = 6;
        }
      } while (iVar30 == 0);
    } while (iVar30 != 6);
    lVar39 = (ulong)((uint)sVar41 & 0xf) - 8;
    if (lVar39 != 0) {
      uVar42 = sVar41 & 0xfffffffffffffff0;
      lVar32 = 0;
      do {
        lVar31 = lVar32 * 0x60;
        pSVar5 = context->scene;
        ppfVar6 = (pSVar5->vertices).items;
        pfVar7 = ppfVar6[*(uint *)(uVar42 + 0x48 + lVar31)];
        auVar66._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x28 + lVar31));
        auVar66._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 8 + lVar31));
        pfVar8 = ppfVar6[*(uint *)(uVar42 + 0x40 + lVar31)];
        auVar67._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x20 + lVar31));
        auVar67._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + lVar31));
        pfVar9 = ppfVar6[*(uint *)(uVar42 + 0x4c + lVar31)];
        auVar73._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar42 + 0x2c + lVar31));
        auVar73._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar42 + 0xc + lVar31));
        pfVar10 = ppfVar6[*(uint *)(uVar42 + 0x44 + lVar31)];
        auVar74._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar42 + 0x24 + lVar31));
        auVar74._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar42 + 4 + lVar31));
        lVar1 = uVar42 + 0x40 + lVar31;
        local_fc0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_fb0 = local_fc0;
        uStack_fa8 = uStack_fb8;
        lVar1 = uVar42 + 0x50 + lVar31;
        local_1240 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1238 = *(undefined8 *)(lVar1 + 0x18);
        auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x10 + lVar31)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x18 + lVar31)));
        auVar45 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x10 + lVar31)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x18 + lVar31)));
        auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar42 + 0x14 + lVar31)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar42 + 0x1c + lVar31)));
        auVar46 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar42 + 0x14 + lVar31)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar42 + 0x1c + lVar31)));
        auVar90 = vunpcklps_avx(auVar45,auVar46);
        auVar89 = vunpcklps_avx(auVar47,auVar48);
        auVar45 = vunpckhps_avx(auVar47,auVar48);
        auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x30 + lVar31)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x38 + lVar31)));
        auVar46 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x30 + lVar31)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x38 + lVar31)));
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar42 + 0x34 + lVar31)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar42 + 0x3c + lVar31)));
        auVar47 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar42 + 0x34 + lVar31)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar42 + 0x3c + lVar31)));
        auVar47 = vunpcklps_avx(auVar46,auVar47);
        auVar54 = vunpcklps_avx(auVar48,auVar57);
        auVar46 = vunpckhps_avx(auVar48,auVar57);
        uStack_1230 = local_1240;
        uStack_1228 = uStack_1238;
        auVar86 = vunpcklps_avx(auVar74,auVar73);
        auVar85 = vunpcklps_avx(auVar67,auVar66);
        auVar69 = vunpcklps_avx(auVar85,auVar86);
        auVar85 = vunpckhps_avx(auVar85,auVar86);
        auVar86 = vunpckhps_avx(auVar74,auVar73);
        auVar68 = vunpckhps_avx(auVar67,auVar66);
        auVar68 = vunpcklps_avx(auVar68,auVar86);
        auVar71._16_16_ = auVar89;
        auVar71._0_16_ = auVar89;
        auVar75._16_16_ = auVar45;
        auVar75._0_16_ = auVar45;
        auVar70._16_16_ = auVar90;
        auVar70._0_16_ = auVar90;
        auVar76._16_16_ = auVar54;
        auVar76._0_16_ = auVar54;
        auVar77._16_16_ = auVar46;
        auVar77._0_16_ = auVar46;
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar78._4_4_ = uVar2;
        auVar78._0_4_ = uVar2;
        auVar78._8_4_ = uVar2;
        auVar78._12_4_ = uVar2;
        auVar78._16_4_ = uVar2;
        auVar78._20_4_ = uVar2;
        auVar78._24_4_ = uVar2;
        auVar78._28_4_ = uVar2;
        auVar64 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar65 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar92._4_4_ = uVar2;
        auVar92._0_4_ = uVar2;
        auVar92._8_4_ = uVar2;
        auVar92._12_4_ = uVar2;
        auVar92._16_4_ = uVar2;
        auVar92._20_4_ = uVar2;
        auVar92._24_4_ = uVar2;
        auVar92._28_4_ = uVar2;
        auVar72._16_16_ = auVar47;
        auVar72._0_16_ = auVar47;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar95._4_4_ = uVar2;
        auVar95._0_4_ = uVar2;
        auVar95._8_4_ = uVar2;
        auVar95._12_4_ = uVar2;
        auVar95._16_4_ = uVar2;
        auVar95._20_4_ = uVar2;
        auVar95._24_4_ = uVar2;
        auVar95._28_4_ = uVar2;
        fVar110 = *(float *)(ray + k * 4 + 0x60);
        auVar103._4_4_ = fVar110;
        auVar103._0_4_ = fVar110;
        auVar103._8_4_ = fVar110;
        auVar103._12_4_ = fVar110;
        auVar103._16_4_ = fVar110;
        auVar103._20_4_ = fVar110;
        auVar103._24_4_ = fVar110;
        auVar103._28_4_ = fVar110;
        auVar86 = vsubps_avx(auVar69,auVar78);
        auVar66 = vsubps_avx512vl(auVar85,auVar64);
        auVar67 = vsubps_avx512vl(auVar68,auVar65);
        auVar68 = vsubps_avx512vl(auVar71,auVar78);
        auVar69 = vsubps_avx512vl(auVar75,auVar64);
        auVar70 = vsubps_avx512vl(auVar70,auVar65);
        auVar71 = vsubps_avx512vl(auVar76,auVar78);
        auVar64 = vsubps_avx512vl(auVar77,auVar64);
        auVar72 = vsubps_avx512vl(auVar72,auVar65);
        auVar73 = vsubps_avx512vl(auVar71,auVar86);
        auVar85 = vsubps_avx(auVar64,auVar66);
        auVar74 = vsubps_avx512vl(auVar72,auVar67);
        auVar75 = vsubps_avx512vl(auVar86,auVar68);
        auVar76 = vsubps_avx512vl(auVar66,auVar69);
        auVar77 = vsubps_avx512vl(auVar67,auVar70);
        auVar78 = vsubps_avx512vl(auVar68,auVar71);
        auVar79 = vsubps_avx512vl(auVar69,auVar64);
        auVar80 = vsubps_avx512vl(auVar70,auVar72);
        auVar81 = vaddps_avx512vl(auVar71,auVar86);
        auVar98._0_4_ = auVar64._0_4_ + auVar66._0_4_;
        auVar98._4_4_ = auVar64._4_4_ + auVar66._4_4_;
        auVar98._8_4_ = auVar64._8_4_ + auVar66._8_4_;
        auVar98._12_4_ = auVar64._12_4_ + auVar66._12_4_;
        auVar98._16_4_ = auVar64._16_4_ + auVar66._16_4_;
        auVar98._20_4_ = auVar64._20_4_ + auVar66._20_4_;
        auVar98._24_4_ = auVar64._24_4_ + auVar66._24_4_;
        auVar98._28_4_ = auVar64._28_4_ + auVar66._28_4_;
        auVar65 = vaddps_avx512vl(auVar72,auVar67);
        auVar82 = vmulps_avx512vl(auVar98,auVar74);
        auVar82 = vfmsub231ps_avx512vl(auVar82,auVar85,auVar65);
        auVar65 = vmulps_avx512vl(auVar65,auVar73);
        auVar83 = vfmsub231ps_avx512vl(auVar65,auVar74,auVar81);
        auVar65._4_4_ = auVar85._4_4_ * auVar81._4_4_;
        auVar65._0_4_ = auVar85._0_4_ * auVar81._0_4_;
        auVar65._8_4_ = auVar85._8_4_ * auVar81._8_4_;
        auVar65._12_4_ = auVar85._12_4_ * auVar81._12_4_;
        auVar65._16_4_ = auVar85._16_4_ * auVar81._16_4_;
        auVar65._20_4_ = auVar85._20_4_ * auVar81._20_4_;
        auVar65._24_4_ = auVar85._24_4_ * auVar81._24_4_;
        auVar65._28_4_ = auVar81._28_4_;
        auVar45 = vfmsub231ps_fma(auVar65,auVar73,auVar98);
        auVar84._0_4_ = fVar110 * auVar45._0_4_;
        auVar84._4_4_ = fVar110 * auVar45._4_4_;
        auVar84._8_4_ = fVar110 * auVar45._8_4_;
        auVar84._12_4_ = fVar110 * auVar45._12_4_;
        auVar84._16_4_ = fVar110 * 0.0;
        auVar84._20_4_ = fVar110 * 0.0;
        auVar84._24_4_ = fVar110 * 0.0;
        auVar84._28_4_ = 0;
        auVar65 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar83);
        auVar65 = vfmadd231ps_avx512vl(auVar65,auVar92,auVar82);
        auVar81 = vaddps_avx512vl(auVar86,auVar68);
        auVar82 = vaddps_avx512vl(auVar66,auVar69);
        auVar83 = vaddps_avx512vl(auVar67,auVar70);
        auVar84 = vmulps_avx512vl(auVar82,auVar77);
        auVar84 = vfmsub231ps_avx512vl(auVar84,auVar76,auVar83);
        auVar83 = vmulps_avx512vl(auVar83,auVar75);
        auVar83 = vfmsub231ps_avx512vl(auVar83,auVar77,auVar81);
        auVar81 = vmulps_avx512vl(auVar81,auVar76);
        auVar82 = vfmsub231ps_avx512vl(auVar81,auVar75,auVar82);
        auVar81._4_4_ = auVar82._4_4_ * fVar110;
        auVar81._0_4_ = auVar82._0_4_ * fVar110;
        auVar81._8_4_ = auVar82._8_4_ * fVar110;
        auVar81._12_4_ = auVar82._12_4_ * fVar110;
        auVar81._16_4_ = auVar82._16_4_ * fVar110;
        auVar81._20_4_ = auVar82._20_4_ * fVar110;
        auVar81._24_4_ = auVar82._24_4_ * fVar110;
        auVar81._28_4_ = auVar82._28_4_;
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar95,auVar83);
        local_1160 = vfmadd231ps_avx512vl(auVar81,auVar92,auVar84);
        auVar68 = vaddps_avx512vl(auVar68,auVar71);
        auVar69 = vaddps_avx512vl(auVar69,auVar64);
        auVar64 = vaddps_avx512vl(auVar70,auVar72);
        auVar81 = vmulps_avx512vl(auVar69,auVar80);
        auVar81 = vfmsub231ps_avx512vl(auVar81,auVar79,auVar64);
        auVar64 = vmulps_avx512vl(auVar64,auVar78);
        auVar64 = vfmsub231ps_avx512vl(auVar64,auVar80,auVar68);
        auVar68 = vmulps_avx512vl(auVar68,auVar79);
        auVar68 = vfmsub231ps_avx512vl(auVar68,auVar78,auVar69);
        auVar68 = vmulps_avx512vl(auVar68,auVar103);
        auVar68 = vfmadd231ps_avx512vl(auVar68,auVar95,auVar64);
        auVar81 = vfmadd231ps_avx512vl(auVar68,auVar92,auVar81);
        auVar82._0_4_ = local_1160._0_4_ + auVar65._0_4_;
        auVar82._4_4_ = local_1160._4_4_ + auVar65._4_4_;
        auVar82._8_4_ = local_1160._8_4_ + auVar65._8_4_;
        auVar82._12_4_ = local_1160._12_4_ + auVar65._12_4_;
        auVar82._16_4_ = local_1160._16_4_ + auVar65._16_4_;
        auVar82._20_4_ = local_1160._20_4_ + auVar65._20_4_;
        auVar82._24_4_ = local_1160._24_4_ + auVar65._24_4_;
        auVar82._28_4_ = local_1160._28_4_ + auVar65._28_4_;
        local_1140 = vaddps_avx512vl(auVar81,auVar82);
        auVar68._8_4_ = 0x7fffffff;
        auVar68._0_8_ = 0x7fffffff7fffffff;
        auVar68._12_4_ = 0x7fffffff;
        auVar68._16_4_ = 0x7fffffff;
        auVar68._20_4_ = 0x7fffffff;
        auVar68._24_4_ = 0x7fffffff;
        auVar68._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_1140,auVar68);
        auVar69._8_4_ = 0x34000000;
        auVar69._0_8_ = 0x3400000034000000;
        auVar69._12_4_ = 0x34000000;
        auVar69._16_4_ = 0x34000000;
        auVar69._20_4_ = 0x34000000;
        auVar69._24_4_ = 0x34000000;
        auVar69._28_4_ = 0x34000000;
        auVar68 = vmulps_avx512vl(local_1140,auVar69);
        auVar69 = vminps_avx512vl(auVar65,local_1160);
        auVar69 = vminps_avx512vl(auVar69,auVar81);
        auVar64._8_4_ = 0x80000000;
        auVar64._0_8_ = 0x8000000080000000;
        auVar64._12_4_ = 0x80000000;
        auVar64._16_4_ = 0x80000000;
        auVar64._20_4_ = 0x80000000;
        auVar64._24_4_ = 0x80000000;
        auVar64._28_4_ = 0x80000000;
        auVar64 = vxorps_avx512vl(auVar68,auVar64);
        uVar16 = vcmpps_avx512vl(auVar69,auVar64,5);
        auVar69 = vmaxps_avx512vl(auVar65,local_1160);
        auVar69 = vmaxps_avx512vl(auVar69,auVar81);
        uVar17 = vcmpps_avx512vl(auVar69,auVar68,2);
        bVar33 = (byte)uVar16 | (byte)uVar17;
        if (bVar33 != 0) {
          auVar68 = vmulps_avx512vl(auVar76,auVar74);
          auVar69 = vmulps_avx512vl(auVar73,auVar77);
          auVar64 = vmulps_avx512vl(auVar75,auVar85);
          auVar81 = vmulps_avx512vl(auVar79,auVar77);
          auVar70 = vmulps_avx512vl(auVar75,auVar80);
          auVar71 = vmulps_avx512vl(auVar78,auVar76);
          auVar85 = vfmsub213ps_avx512vl(auVar85,auVar77,auVar68);
          auVar72 = vfmsub213ps_avx512vl(auVar74,auVar75,auVar69);
          auVar73 = vfmsub213ps_avx512vl(auVar73,auVar76,auVar64);
          auVar74 = vfmsub213ps_avx512vl(auVar80,auVar76,auVar81);
          auVar76 = vfmsub213ps_avx512vl(auVar78,auVar77,auVar70);
          auVar75 = vfmsub213ps_avx512vl(auVar79,auVar75,auVar71);
          auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar68,auVar77);
          vandps_avx512vl(auVar81,auVar77);
          uVar43 = vcmpps_avx512vl(auVar77,auVar77,1);
          vandps_avx512vl(auVar69,auVar77);
          vandps_avx512vl(auVar70,auVar77);
          uVar44 = vcmpps_avx512vl(auVar77,auVar77,1);
          vandps_avx512vl(auVar64,auVar77);
          vandps_avx512vl(auVar71,auVar77);
          uVar36 = vcmpps_avx512vl(auVar77,auVar77,1);
          bVar15 = (bool)((byte)uVar43 & 1);
          local_1120._0_4_ = (float)((uint)bVar15 * auVar85._0_4_ | (uint)!bVar15 * auVar74._0_4_);
          bVar15 = (bool)((byte)(uVar43 >> 1) & 1);
          local_1120._4_4_ = (float)((uint)bVar15 * auVar85._4_4_ | (uint)!bVar15 * auVar74._4_4_);
          bVar15 = (bool)((byte)(uVar43 >> 2) & 1);
          local_1120._8_4_ = (float)((uint)bVar15 * auVar85._8_4_ | (uint)!bVar15 * auVar74._8_4_);
          bVar15 = (bool)((byte)(uVar43 >> 3) & 1);
          local_1120._12_4_ =
               (float)((uint)bVar15 * auVar85._12_4_ | (uint)!bVar15 * auVar74._12_4_);
          bVar15 = (bool)((byte)(uVar43 >> 4) & 1);
          local_1120._16_4_ =
               (float)((uint)bVar15 * auVar85._16_4_ | (uint)!bVar15 * auVar74._16_4_);
          bVar15 = (bool)((byte)(uVar43 >> 5) & 1);
          local_1120._20_4_ =
               (float)((uint)bVar15 * auVar85._20_4_ | (uint)!bVar15 * auVar74._20_4_);
          bVar15 = (bool)((byte)(uVar43 >> 6) & 1);
          local_1120._24_4_ =
               (float)((uint)bVar15 * auVar85._24_4_ | (uint)!bVar15 * auVar74._24_4_);
          bVar15 = SUB81(uVar43 >> 7,0);
          local_1120._28_4_ = (uint)bVar15 * auVar85._28_4_ | (uint)!bVar15 * auVar74._28_4_;
          bVar15 = (bool)((byte)uVar44 & 1);
          local_1100._0_4_ = (float)((uint)bVar15 * auVar72._0_4_ | (uint)!bVar15 * auVar76._0_4_);
          bVar15 = (bool)((byte)(uVar44 >> 1) & 1);
          local_1100._4_4_ = (float)((uint)bVar15 * auVar72._4_4_ | (uint)!bVar15 * auVar76._4_4_);
          bVar15 = (bool)((byte)(uVar44 >> 2) & 1);
          local_1100._8_4_ = (float)((uint)bVar15 * auVar72._8_4_ | (uint)!bVar15 * auVar76._8_4_);
          bVar15 = (bool)((byte)(uVar44 >> 3) & 1);
          local_1100._12_4_ =
               (float)((uint)bVar15 * auVar72._12_4_ | (uint)!bVar15 * auVar76._12_4_);
          bVar15 = (bool)((byte)(uVar44 >> 4) & 1);
          local_1100._16_4_ =
               (float)((uint)bVar15 * auVar72._16_4_ | (uint)!bVar15 * auVar76._16_4_);
          bVar15 = (bool)((byte)(uVar44 >> 5) & 1);
          local_1100._20_4_ =
               (float)((uint)bVar15 * auVar72._20_4_ | (uint)!bVar15 * auVar76._20_4_);
          bVar15 = (bool)((byte)(uVar44 >> 6) & 1);
          local_1100._24_4_ =
               (float)((uint)bVar15 * auVar72._24_4_ | (uint)!bVar15 * auVar76._24_4_);
          bVar15 = SUB81(uVar44 >> 7,0);
          local_1100._28_4_ = (uint)bVar15 * auVar72._28_4_ | (uint)!bVar15 * auVar76._28_4_;
          bVar15 = (bool)((byte)uVar36 & 1);
          local_10e0 = (float)((uint)bVar15 * auVar73._0_4_ | (uint)!bVar15 * auVar75._0_4_);
          bVar15 = (bool)((byte)(uVar36 >> 1) & 1);
          fStack_10dc = (float)((uint)bVar15 * auVar73._4_4_ | (uint)!bVar15 * auVar75._4_4_);
          bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
          fStack_10d8 = (float)((uint)bVar15 * auVar73._8_4_ | (uint)!bVar15 * auVar75._8_4_);
          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
          fStack_10d4 = (float)((uint)bVar15 * auVar73._12_4_ | (uint)!bVar15 * auVar75._12_4_);
          bVar15 = (bool)((byte)(uVar36 >> 4) & 1);
          fStack_10d0 = (float)((uint)bVar15 * auVar73._16_4_ | (uint)!bVar15 * auVar75._16_4_);
          bVar15 = (bool)((byte)(uVar36 >> 5) & 1);
          fStack_10cc = (float)((uint)bVar15 * auVar73._20_4_ | (uint)!bVar15 * auVar75._20_4_);
          bVar15 = (bool)((byte)(uVar36 >> 6) & 1);
          fStack_10c8 = (float)((uint)bVar15 * auVar73._24_4_ | (uint)!bVar15 * auVar75._24_4_);
          bVar15 = SUB81(uVar36 >> 7,0);
          uStack_10c4 = (uint)bVar15 * auVar73._28_4_ | (uint)!bVar15 * auVar75._28_4_;
          auVar80._4_4_ = fVar110 * fStack_10dc;
          auVar80._0_4_ = fVar110 * local_10e0;
          auVar80._8_4_ = fVar110 * fStack_10d8;
          auVar80._12_4_ = fVar110 * fStack_10d4;
          auVar80._16_4_ = fVar110 * fStack_10d0;
          auVar80._20_4_ = fVar110 * fStack_10cc;
          auVar80._24_4_ = fVar110 * fStack_10c8;
          auVar80._28_4_ = fVar110;
          auVar45 = vfmadd213ps_fma(auVar95,local_1100,auVar80);
          auVar45 = vfmadd213ps_fma(auVar92,local_1120,ZEXT1632(auVar45));
          auVar68 = ZEXT1632(CONCAT412(auVar45._12_4_ + auVar45._12_4_,
                                       CONCAT48(auVar45._8_4_ + auVar45._8_4_,
                                                CONCAT44(auVar45._4_4_ + auVar45._4_4_,
                                                         auVar45._0_4_ + auVar45._0_4_))));
          auVar83._0_4_ = auVar67._0_4_ * local_10e0;
          auVar83._4_4_ = auVar67._4_4_ * fStack_10dc;
          auVar83._8_4_ = auVar67._8_4_ * fStack_10d8;
          auVar83._12_4_ = auVar67._12_4_ * fStack_10d4;
          auVar83._16_4_ = auVar67._16_4_ * fStack_10d0;
          auVar83._20_4_ = auVar67._20_4_ * fStack_10cc;
          auVar83._24_4_ = auVar67._24_4_ * fStack_10c8;
          auVar83._28_4_ = 0;
          auVar45 = vfmadd213ps_fma(auVar66,local_1100,auVar83);
          auVar46 = vfmadd213ps_fma(auVar86,local_1120,ZEXT1632(auVar45));
          auVar85 = vrcp14ps_avx512vl(auVar68);
          auVar86._8_4_ = 0x3f800000;
          auVar86._0_8_ = &DAT_3f8000003f800000;
          auVar86._12_4_ = 0x3f800000;
          auVar86._16_4_ = 0x3f800000;
          auVar86._20_4_ = 0x3f800000;
          auVar86._24_4_ = 0x3f800000;
          auVar86._28_4_ = 0x3f800000;
          auVar86 = vfnmadd213ps_avx512vl(auVar85,auVar68,auVar86);
          auVar45 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
          local_1060._28_4_ = auVar67._28_4_;
          local_1060._0_28_ =
               ZEXT1628(CONCAT412((auVar46._12_4_ + auVar46._12_4_) * auVar45._12_4_,
                                  CONCAT48((auVar46._8_4_ + auVar46._8_4_) * auVar45._8_4_,
                                           CONCAT44((auVar46._4_4_ + auVar46._4_4_) * auVar45._4_4_,
                                                    (auVar46._0_4_ + auVar46._0_4_) * auVar45._0_4_)
                                          )));
          auVar88 = ZEXT3264(local_1060);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar85._4_4_ = uVar2;
          auVar85._0_4_ = uVar2;
          auVar85._8_4_ = uVar2;
          auVar85._12_4_ = uVar2;
          auVar85._16_4_ = uVar2;
          auVar85._20_4_ = uVar2;
          auVar85._24_4_ = uVar2;
          auVar85._28_4_ = uVar2;
          uVar16 = vcmpps_avx512vl(local_1060,auVar85,0xd);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar79._4_4_ = uVar2;
          auVar79._0_4_ = uVar2;
          auVar79._8_4_ = uVar2;
          auVar79._12_4_ = uVar2;
          auVar79._16_4_ = uVar2;
          auVar79._20_4_ = uVar2;
          auVar79._24_4_ = uVar2;
          auVar79._28_4_ = uVar2;
          uVar17 = vcmpps_avx512vl(local_1060,auVar79,2);
          bVar33 = (byte)uVar16 & (byte)uVar17 & bVar33;
          if (bVar33 != 0) {
            uVar43 = vcmpps_avx512vl(auVar68,_DAT_02020f00,4);
            uVar43 = bVar33 & uVar43;
            local_10c0 = (byte)uVar43;
            if (local_10c0 != 0) {
              local_1180 = auVar65;
              local_fe0 = 0xf0;
              auVar21._8_4_ = 0x219392ef;
              auVar21._0_8_ = 0x219392ef219392ef;
              auVar21._12_4_ = 0x219392ef;
              auVar21._16_4_ = 0x219392ef;
              auVar21._20_4_ = 0x219392ef;
              auVar21._24_4_ = 0x219392ef;
              auVar21._28_4_ = 0x219392ef;
              uVar44 = vcmpps_avx512vl(local_1140,auVar21,5);
              auVar85 = vrcp14ps_avx512vl(local_1140);
              auVar93._8_4_ = 0x3f800000;
              auVar93._0_8_ = &DAT_3f8000003f800000;
              auVar93._12_4_ = 0x3f800000;
              auVar93._16_4_ = 0x3f800000;
              auVar93._20_4_ = 0x3f800000;
              auVar93._24_4_ = 0x3f800000;
              auVar93._28_4_ = 0x3f800000;
              auVar45 = vfnmadd213ps_fma(local_1140,auVar85,auVar93);
              auVar86 = vfmadd132ps_avx512vl(ZEXT1632(auVar45),auVar85,auVar85);
              fVar104 = (float)((uint)((byte)uVar44 & 1) * auVar86._0_4_);
              fVar110 = (float)((uint)((byte)(uVar44 >> 1) & 1) * auVar86._4_4_);
              fVar105 = (float)((uint)((byte)(uVar44 >> 2) & 1) * auVar86._8_4_);
              fVar106 = (float)((uint)((byte)(uVar44 >> 3) & 1) * auVar86._12_4_);
              fVar107 = (float)((uint)((byte)(uVar44 >> 4) & 1) * auVar86._16_4_);
              fVar108 = (float)((uint)((byte)(uVar44 >> 5) & 1) * auVar86._20_4_);
              fVar109 = (float)((uint)((byte)(uVar44 >> 6) & 1) * auVar86._24_4_);
              auVar23._4_4_ = fVar110 * auVar65._4_4_;
              auVar23._0_4_ = fVar104 * auVar65._0_4_;
              auVar23._8_4_ = fVar105 * auVar65._8_4_;
              auVar23._12_4_ = fVar106 * auVar65._12_4_;
              auVar23._16_4_ = fVar107 * auVar65._16_4_;
              auVar23._20_4_ = fVar108 * auVar65._20_4_;
              auVar23._24_4_ = fVar109 * auVar65._24_4_;
              auVar23._28_4_ = auVar65._28_4_;
              auVar86 = vminps_avx(auVar23,auVar93);
              auVar24._4_4_ = local_1160._4_4_ * fVar110;
              auVar24._0_4_ = local_1160._0_4_ * fVar104;
              auVar24._8_4_ = local_1160._8_4_ * fVar105;
              auVar24._12_4_ = local_1160._12_4_ * fVar106;
              auVar24._16_4_ = local_1160._16_4_ * fVar107;
              auVar24._20_4_ = local_1160._20_4_ * fVar108;
              auVar24._24_4_ = local_1160._24_4_ * fVar109;
              auVar24._28_4_ = auVar85._28_4_;
              auVar85 = vminps_avx(auVar24,auVar93);
              auVar68 = vsubps_avx(auVar93,auVar86);
              auVar69 = vsubps_avx(auVar93,auVar85);
              local_1080 = vblendps_avx(auVar85,auVar68,0xf0);
              local_10a0 = vblendps_avx(auVar86,auVar69,0xf0);
              fVar110 = (float)DAT_02060940;
              fVar109 = DAT_02060940._4_4_;
              fVar108 = DAT_02060940._8_4_;
              fVar107 = DAT_02060940._12_4_;
              fVar106 = DAT_02060940._16_4_;
              fVar105 = DAT_02060940._20_4_;
              fVar104 = DAT_02060940._24_4_;
              local_1040[0] = local_1120._0_4_ * fVar110;
              local_1040[1] = local_1120._4_4_ * fVar109;
              local_1040[2] = local_1120._8_4_ * fVar108;
              local_1040[3] = local_1120._12_4_ * fVar107;
              fStack_1030 = local_1120._16_4_ * fVar106;
              fStack_102c = local_1120._20_4_ * fVar105;
              fStack_1028 = local_1120._24_4_ * fVar104;
              uStack_1024 = local_1120._28_4_;
              local_1000._4_4_ = fStack_10dc * fVar109;
              local_1000._0_4_ = local_10e0 * fVar110;
              local_1000._8_4_ = fStack_10d8 * fVar108;
              local_1000._12_4_ = fStack_10d4 * fVar107;
              local_1000._16_4_ = fStack_10d0 * fVar106;
              local_1000._20_4_ = fStack_10cc * fVar105;
              local_1000._24_4_ = fStack_10c8 * fVar104;
              local_1000._28_4_ = uStack_10c4;
              local_1020[0] = local_1100._0_4_ * fVar110;
              local_1020[1] = local_1100._4_4_ * fVar109;
              local_1020[2] = local_1100._8_4_ * fVar108;
              local_1020[3] = local_1100._12_4_ * fVar107;
              fStack_1010 = local_1100._16_4_ * fVar106;
              fStack_100c = local_1100._20_4_ * fVar105;
              fStack_1008 = local_1100._24_4_ * fVar104;
              uStack_1004 = local_1100._28_4_;
              auVar96._8_4_ = 0x7f800000;
              auVar96._0_8_ = 0x7f8000007f800000;
              auVar96._12_4_ = 0x7f800000;
              auVar96._16_4_ = 0x7f800000;
              auVar96._20_4_ = 0x7f800000;
              auVar96._24_4_ = 0x7f800000;
              auVar96._28_4_ = 0x7f800000;
              auVar111 = ZEXT3264(auVar96);
              auVar86 = vblendmps_avx512vl(auVar96,local_1060);
              auVar87._0_4_ =
                   (uint)(local_10c0 & 1) * auVar86._0_4_ |
                   (uint)!(bool)(local_10c0 & 1) * (int)(local_10e0 * fVar110);
              bVar15 = (bool)((byte)(uVar43 >> 1) & 1);
              auVar87._4_4_ =
                   (uint)bVar15 * auVar86._4_4_ | (uint)!bVar15 * (int)(fStack_10dc * fVar109);
              bVar15 = (bool)((byte)(uVar43 >> 2) & 1);
              auVar87._8_4_ =
                   (uint)bVar15 * auVar86._8_4_ | (uint)!bVar15 * (int)(fStack_10d8 * fVar108);
              bVar15 = (bool)((byte)(uVar43 >> 3) & 1);
              auVar87._12_4_ =
                   (uint)bVar15 * auVar86._12_4_ | (uint)!bVar15 * (int)(fStack_10d4 * fVar107);
              bVar15 = (bool)((byte)(uVar43 >> 4) & 1);
              auVar87._16_4_ =
                   (uint)bVar15 * auVar86._16_4_ | (uint)!bVar15 * (int)(fStack_10d0 * fVar106);
              bVar15 = (bool)((byte)(uVar43 >> 5) & 1);
              auVar87._20_4_ =
                   (uint)bVar15 * auVar86._20_4_ | (uint)!bVar15 * (int)(fStack_10cc * fVar105);
              bVar15 = (bool)((byte)(uVar43 >> 6) & 1);
              auVar87._24_4_ =
                   (uint)bVar15 * auVar86._24_4_ | (uint)!bVar15 * (int)(fStack_10c8 * fVar104);
              bVar15 = SUB81(uVar43 >> 7,0);
              auVar87._28_4_ = (uint)bVar15 * auVar86._28_4_ | !bVar15 * uStack_10c4;
              auVar86 = vshufps_avx(auVar87,auVar87,0xb1);
              auVar86 = vminps_avx(auVar87,auVar86);
              auVar85 = vshufpd_avx(auVar86,auVar86,5);
              auVar86 = vminps_avx(auVar86,auVar85);
              auVar85 = vpermpd_avx2(auVar86,0x4e);
              auVar86 = vminps_avx(auVar86,auVar85);
              uVar16 = vcmpps_avx512vl(auVar87,auVar86,0);
              bVar33 = (byte)uVar16 & local_10c0;
              do {
                uVar34 = (uint)uVar43;
                if (bVar33 != 0) {
                  uVar34 = (uint)bVar33;
                }
                uVar18 = 0;
                for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000) {
                  uVar18 = uVar18 + 1;
                }
                uVar35 = uVar18 & 0xff;
                uVar34 = *(uint *)((long)&local_fc0 + (ulong)uVar35 * 4);
                pGVar11 = (pSVar5->geometries).items[uVar34].ptr;
                auVar86 = auVar87;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar43 = (ulong)(byte)(~(byte)(1 << (uVar18 & 0x1f)) & (byte)uVar43);
LAB_0077c5bb:
                  bVar15 = true;
                }
                else {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    uVar44 = (ulong)(uVar35 * 4);
                    uVar2 = *(undefined4 *)(local_10a0 + uVar44);
                    local_11e0._4_4_ = uVar2;
                    local_11e0._0_4_ = uVar2;
                    local_11e0._8_4_ = uVar2;
                    local_11e0._12_4_ = uVar2;
                    local_11d0 = *(undefined4 *)(local_1080 + uVar44);
                    local_11b0 = vpbroadcastd_avx512vl();
                    uVar2 = *(undefined4 *)((long)&local_1240 + uVar44);
                    local_11c0._4_4_ = uVar2;
                    local_11c0._0_4_ = uVar2;
                    local_11c0._8_4_ = uVar2;
                    local_11c0._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)((long)local_1040 + uVar44);
                    uVar4 = *(undefined4 *)((long)local_1020 + uVar44);
                    local_1200._4_4_ = uVar4;
                    local_1200._0_4_ = uVar4;
                    local_1200._8_4_ = uVar4;
                    local_1200._12_4_ = uVar4;
                    uVar4 = *(undefined4 *)(local_1000 + uVar44);
                    local_11f0._4_4_ = uVar4;
                    local_11f0._0_4_ = uVar4;
                    local_11f0._8_4_ = uVar4;
                    local_11f0._12_4_ = uVar4;
                    local_1210[0] = (RTCHitN)(char)uVar2;
                    local_1210[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1210[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1210[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1210[4] = (RTCHitN)(char)uVar2;
                    local_1210[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1210[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1210[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1210[8] = (RTCHitN)(char)uVar2;
                    local_1210[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1210[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1210[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1210[0xc] = (RTCHitN)(char)uVar2;
                    local_1210[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1210[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1210[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    uStack_11cc = local_11d0;
                    uStack_11c8 = local_11d0;
                    uStack_11c4 = local_11d0;
                    vpcmpeqd_avx2(ZEXT1632(local_11e0),ZEXT1632(local_11e0));
                    uStack_119c = context->user->instID[0];
                    local_11a0 = uStack_119c;
                    uStack_1198 = uStack_119c;
                    uStack_1194 = uStack_119c;
                    uStack_1190 = context->user->instPrimID[0];
                    uStack_118c = uStack_1190;
                    uStack_1188 = uStack_1190;
                    uStack_1184 = uStack_1190;
                    uVar3 = *(uint *)(ray + k * 4 + 0x80);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar44);
                    local_1380 = local_12b0._0_8_;
                    uStack_1378 = local_12b0._8_8_;
                    local_1340.valid = (int *)&local_1380;
                    local_1340.geometryUserPtr = pGVar11->userPtr;
                    local_1340.context = context->user;
                    local_1340.hit = local_1210;
                    local_1340.N = 4;
                    local_1260 = auVar88._0_32_;
                    local_1340.ray = (RTCRayN *)ray;
                    if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_1370 = lVar39;
                      (*pGVar11->intersectionFilterN)(&local_1340);
                      auVar88 = ZEXT3264(local_1260);
                      auVar111 = ZEXT3264(CONCAT428(0x7f800000,
                                                    CONCAT424(0x7f800000,
                                                              CONCAT420(0x7f800000,
                                                                        CONCAT416(0x7f800000,
                                                                                  CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar117 = ZEXT1664(local_1310);
                      auVar116 = ZEXT1664(local_1300);
                      auVar115 = ZEXT1664(local_12f0);
                      auVar114 = ZEXT1664(local_12e0);
                      auVar113 = ZEXT1664(local_12d0);
                      auVar112 = ZEXT1664(local_12c0);
                      lVar39 = local_1370;
                    }
                    auVar27._8_8_ = uStack_1378;
                    auVar27._0_8_ = local_1380;
                    uVar44 = vptestmd_avx512vl(auVar27,auVar27);
                    if ((uVar44 & 0xf) == 0) {
LAB_0077c8f5:
                      auVar86 = ZEXT432(uVar3);
                      *(uint *)(ray + k * 4 + 0x80) = uVar3;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&local_1340);
                        auVar88 = ZEXT3264(local_1260);
                        auVar111 = ZEXT3264(CONCAT428(0x7f800000,
                                                      CONCAT424(0x7f800000,
                                                                CONCAT420(0x7f800000,
                                                                          CONCAT416(0x7f800000,
                                                                                    CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        auVar117 = ZEXT1664(local_1310);
                        auVar116 = ZEXT1664(local_1300);
                        auVar115 = ZEXT1664(local_12f0);
                        auVar114 = ZEXT1664(local_12e0);
                        auVar113 = ZEXT1664(local_12d0);
                        auVar112 = ZEXT1664(local_12c0);
                      }
                      auVar28._8_8_ = uStack_1378;
                      auVar28._0_8_ = local_1380;
                      uVar44 = vptestmd_avx512vl(auVar28,auVar28);
                      uVar44 = uVar44 & 0xf;
                      bVar33 = (byte)uVar44;
                      if (bVar33 == 0) goto LAB_0077c8f5;
                      iVar30 = *(int *)(local_1340.hit + 4);
                      iVar25 = *(int *)(local_1340.hit + 8);
                      iVar26 = *(int *)(local_1340.hit + 0xc);
                      bVar15 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar14 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_1340.ray + 0xc0) =
                           (uint)(bVar33 & 1) * *(int *)local_1340.hit |
                           (uint)!(bool)(bVar33 & 1) * *(int *)(local_1340.ray + 0xc0);
                      *(uint *)(local_1340.ray + 0xc4) =
                           (uint)bVar15 * iVar30 | (uint)!bVar15 * *(int *)(local_1340.ray + 0xc4);
                      *(uint *)(local_1340.ray + 200) =
                           (uint)bVar13 * iVar25 | (uint)!bVar13 * *(int *)(local_1340.ray + 200);
                      *(uint *)(local_1340.ray + 0xcc) =
                           (uint)bVar14 * iVar26 | (uint)!bVar14 * *(int *)(local_1340.ray + 0xcc);
                      iVar30 = *(int *)(local_1340.hit + 0x14);
                      iVar25 = *(int *)(local_1340.hit + 0x18);
                      iVar26 = *(int *)(local_1340.hit + 0x1c);
                      bVar15 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar14 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_1340.ray + 0xd0) =
                           (uint)(bVar33 & 1) * *(int *)(local_1340.hit + 0x10) |
                           (uint)!(bool)(bVar33 & 1) * *(int *)(local_1340.ray + 0xd0);
                      *(uint *)(local_1340.ray + 0xd4) =
                           (uint)bVar15 * iVar30 | (uint)!bVar15 * *(int *)(local_1340.ray + 0xd4);
                      *(uint *)(local_1340.ray + 0xd8) =
                           (uint)bVar13 * iVar25 | (uint)!bVar13 * *(int *)(local_1340.ray + 0xd8);
                      *(uint *)(local_1340.ray + 0xdc) =
                           (uint)bVar14 * iVar26 | (uint)!bVar14 * *(int *)(local_1340.ray + 0xdc);
                      iVar30 = *(int *)(local_1340.hit + 0x24);
                      iVar25 = *(int *)(local_1340.hit + 0x28);
                      iVar26 = *(int *)(local_1340.hit + 0x2c);
                      bVar15 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar14 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_1340.ray + 0xe0) =
                           (uint)(bVar33 & 1) * *(int *)(local_1340.hit + 0x20) |
                           (uint)!(bool)(bVar33 & 1) * *(int *)(local_1340.ray + 0xe0);
                      *(uint *)(local_1340.ray + 0xe4) =
                           (uint)bVar15 * iVar30 | (uint)!bVar15 * *(int *)(local_1340.ray + 0xe4);
                      *(uint *)(local_1340.ray + 0xe8) =
                           (uint)bVar13 * iVar25 | (uint)!bVar13 * *(int *)(local_1340.ray + 0xe8);
                      *(uint *)(local_1340.ray + 0xec) =
                           (uint)bVar14 * iVar26 | (uint)!bVar14 * *(int *)(local_1340.ray + 0xec);
                      iVar30 = *(int *)(local_1340.hit + 0x34);
                      iVar25 = *(int *)(local_1340.hit + 0x38);
                      iVar26 = *(int *)(local_1340.hit + 0x3c);
                      bVar15 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar14 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_1340.ray + 0xf0) =
                           (uint)(bVar33 & 1) * *(int *)(local_1340.hit + 0x30) |
                           (uint)!(bool)(bVar33 & 1) * *(int *)(local_1340.ray + 0xf0);
                      *(uint *)(local_1340.ray + 0xf4) =
                           (uint)bVar15 * iVar30 | (uint)!bVar15 * *(int *)(local_1340.ray + 0xf4);
                      *(uint *)(local_1340.ray + 0xf8) =
                           (uint)bVar13 * iVar25 | (uint)!bVar13 * *(int *)(local_1340.ray + 0xf8);
                      *(uint *)(local_1340.ray + 0xfc) =
                           (uint)bVar14 * iVar26 | (uint)!bVar14 * *(int *)(local_1340.ray + 0xfc);
                      auVar45 = *(undefined1 (*) [16])(local_1340.ray + 0x100);
                      auVar63._0_4_ =
                           (uint)(bVar33 & 1) * *(int *)(local_1340.hit + 0x40) |
                           (uint)!(bool)(bVar33 & 1) * auVar45._0_4_;
                      bVar15 = (bool)((byte)(uVar44 >> 1) & 1);
                      auVar63._4_4_ =
                           (uint)bVar15 * *(int *)(local_1340.hit + 0x44) |
                           (uint)!bVar15 * auVar45._4_4_;
                      bVar15 = (bool)((byte)(uVar44 >> 2) & 1);
                      auVar63._8_4_ =
                           (uint)bVar15 * *(int *)(local_1340.hit + 0x48) |
                           (uint)!bVar15 * auVar45._8_4_;
                      bVar15 = SUB81(uVar44 >> 3,0);
                      auVar63._12_4_ =
                           (uint)bVar15 * *(int *)(local_1340.hit + 0x4c) |
                           (uint)!bVar15 * auVar45._12_4_;
                      *(undefined1 (*) [16])(local_1340.ray + 0x100) = auVar63;
                      auVar45 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1340.hit + 0x50));
                      *(undefined1 (*) [16])(local_1340.ray + 0x110) = auVar45;
                      auVar45 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1340.hit + 0x60));
                      *(undefined1 (*) [16])(local_1340.ray + 0x120) = auVar45;
                      auVar45 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1340.hit + 0x70));
                      *(undefined1 (*) [16])(local_1340.ray + 0x130) = auVar45;
                      auVar86 = ZEXT1632(*(undefined1 (*) [16])(local_1340.hit + 0x80));
                      auVar45 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1340.hit + 0x80));
                      *(undefined1 (*) [16])(local_1340.ray + 0x140) = auVar45;
                    }
                    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar22._4_4_ = uVar2;
                    auVar22._0_4_ = uVar2;
                    auVar22._8_4_ = uVar2;
                    auVar22._12_4_ = uVar2;
                    auVar22._16_4_ = uVar2;
                    auVar22._20_4_ = uVar2;
                    auVar22._24_4_ = uVar2;
                    auVar22._28_4_ = uVar2;
                    uVar44 = vcmpps_avx512vl(auVar88._0_32_,auVar22,2);
                    uVar43 = (byte)(~(byte)(1 << (uVar18 & 0x1f)) & (byte)uVar43) & uVar44;
                    goto LAB_0077c5bb;
                  }
                  bVar15 = false;
                }
                if (!bVar15) {
                  uVar43 = (ulong)(uVar35 << 2);
                  uVar2 = *(undefined4 *)(local_10a0 + uVar43);
                  uVar4 = *(undefined4 *)(local_1080 + uVar43);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar43);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_1040 + uVar43);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_1020 + uVar43);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1000 + uVar43);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_1240 + uVar43)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar34;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                bVar33 = (byte)uVar43;
                if (bVar33 == 0) break;
                auVar85 = vblendmps_avx512vl(auVar111._0_32_,auVar88._0_32_);
                auVar87._0_4_ =
                     (uint)(bVar33 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar33 & 1) * auVar86._0_4_;
                bVar15 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar87._4_4_ = (uint)bVar15 * auVar85._4_4_ | (uint)!bVar15 * auVar86._4_4_;
                bVar15 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar87._8_4_ = (uint)bVar15 * auVar85._8_4_ | (uint)!bVar15 * auVar86._8_4_;
                bVar15 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar87._12_4_ = (uint)bVar15 * auVar85._12_4_ | (uint)!bVar15 * auVar86._12_4_;
                bVar15 = (bool)((byte)(uVar43 >> 4) & 1);
                auVar87._16_4_ = (uint)bVar15 * auVar85._16_4_ | (uint)!bVar15 * auVar86._16_4_;
                bVar15 = (bool)((byte)(uVar43 >> 5) & 1);
                auVar87._20_4_ = (uint)bVar15 * auVar85._20_4_ | (uint)!bVar15 * auVar86._20_4_;
                bVar15 = (bool)((byte)(uVar43 >> 6) & 1);
                auVar87._24_4_ = (uint)bVar15 * auVar85._24_4_ | (uint)!bVar15 * auVar86._24_4_;
                bVar15 = SUB81(uVar43 >> 7,0);
                auVar87._28_4_ = (uint)bVar15 * auVar85._28_4_ | (uint)!bVar15 * auVar86._28_4_;
                auVar86 = vshufps_avx(auVar87,auVar87,0xb1);
                auVar86 = vminps_avx(auVar87,auVar86);
                auVar85 = vshufpd_avx(auVar86,auVar86,5);
                auVar86 = vminps_avx(auVar86,auVar85);
                auVar85 = vpermpd_avx2(auVar86,0x4e);
                auVar86 = vminps_avx(auVar86,auVar85);
                uVar16 = vcmpps_avx512vl(auVar87,auVar86,0);
                bVar33 = (byte)uVar16 & bVar33;
              } while( true );
            }
          }
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 != lVar39);
    }
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar88 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
    auVar111 = ZEXT1664(local_12a0);
    fVar110 = fStack_1284;
    fVar109 = fStack_1288;
    fVar108 = fStack_128c;
    fVar107 = local_1290;
    fVar106 = fStack_1274;
    fVar105 = fStack_1278;
    fVar104 = fStack_127c;
    fVar102 = local_1280;
    fVar101 = fStack_1264;
    fVar100 = fStack_1268;
    fVar99 = fStack_126c;
    fVar97 = local_1270;
    uVar42 = local_1358;
    uVar43 = local_1368;
    uVar44 = local_1360;
    uVar36 = local_1350;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }